

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int lyp_check_identifier(ly_ctx *ctx,char *id,LY_IDENT type,lys_module *module,lys_node *parent)

{
  char cVar1;
  ushort uVar2;
  LYS_NODE LVar3;
  lys_tpdf *plVar4;
  lys_include *plVar5;
  lys_import *plVar6;
  lys_submodule *plVar7;
  int iVar8;
  ulong uVar9;
  lys_node *plVar10;
  lys_module *plVar11;
  byte bVar12;
  LY_ECODE ecode;
  long lVar13;
  char *pcVar14;
  char *pcVar15;
  ulong local_48;
  uint local_38;
  
  if ((ctx == (ly_ctx *)0x0) || (id == (char *)0x0)) {
    __assert_fail("ctx && id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                  ,0x8e7,
                  "int lyp_check_identifier(struct ly_ctx *, const char *, enum LY_IDENT, struct lys_module *, struct lys_node *)"
                 );
  }
  cVar1 = *id;
  if ((0x19 < (byte)(cVar1 + 0xbfU)) && (cVar1 != '_' && 0x19 < (byte)(cVar1 + 0x9fU))) {
    pcVar15 = "invalid start character";
LAB_00127fab:
    ecode = LYE_INID;
    pcVar14 = id;
    id = pcVar15;
    goto LAB_00127fba;
  }
  bVar12 = id[1];
  if (bVar12 != 0) {
    uVar9 = 0;
    do {
      if (((9 < (byte)(bVar12 - 0x30)) && (0x19 < (byte)((bVar12 & 0xdf) + 0xbf))) &&
         ((0x32 < bVar12 - 0x2d || ((0x4000000000003U >> ((ulong)(bVar12 - 0x2d) & 0x3f) & 1) == 0))
         )) {
        pcVar15 = "invalid character";
        goto LAB_00127fab;
      }
      bVar12 = id[uVar9 + 2];
      uVar9 = uVar9 + 1;
    } while (bVar12 != 0);
    if (0x3f < uVar9) {
      ly_log(ctx,LY_LLWRN,LY_SUCCESS,"Identifier \"%s\" is long, you should use something shorter.",
             id);
    }
  }
  switch(type) {
  case LY_IDENT_FEATURE:
    if (module == (lys_module *)0x0) {
      __assert_fail("module",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                    ,0x94d,
                    "int lyp_check_identifier(struct ly_ctx *, const char *, enum LY_IDENT, struct lys_module *, struct lys_node *)"
                   );
    }
    plVar11 = lys_main_module(module);
    iVar8 = dup_feature_check(id,module);
    if (iVar8 == 0) {
      bVar12 = plVar11->inc_size;
      if (bVar12 == 0) {
        return 0;
      }
      plVar5 = plVar11->inc;
      lVar13 = 0;
      while( true ) {
        plVar11 = *(lys_module **)(plVar5->rev + lVar13 + -8);
        if (plVar11 == (lys_module *)0x0) {
          return 0;
        }
        iVar8 = dup_feature_check(id,plVar11);
        if (iVar8 != 0) break;
        lVar13 = lVar13 + 0x30;
        if ((ulong)bVar12 * 0x30 == lVar13) {
          return 0;
        }
      }
      pcVar14 = "feature";
    }
    else {
      pcVar14 = "feature";
    }
    break;
  default:
    return 0;
  case LY_IDENT_TYPE:
    if (module == (lys_module *)0x0) {
      __assert_fail("module",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                    ,0x909,
                    "int lyp_check_identifier(struct ly_ctx *, const char *, enum LY_IDENT, struct lys_module *, struct lys_node *)"
                   );
    }
    plVar11 = lys_main_module(module);
    iVar8 = strcmp(id,"binary");
    if ((((((((iVar8 == 0) || (iVar8 = strcmp(id,"bits"), iVar8 == 0)) ||
            (iVar8 = strcmp(id,"boolean"), iVar8 == 0)) ||
           ((iVar8 = strcmp(id,"decimal64"), iVar8 == 0 || (iVar8 = strcmp(id,"empty"), iVar8 == 0))
           )) || ((iVar8 = strcmp(id,"enumeration"), iVar8 == 0 ||
                  ((iVar8 = strcmp(id,"identityref"), iVar8 == 0 ||
                   (iVar8 = strcmp(id,"instance-identifier"), iVar8 == 0)))))) ||
         ((iVar8 = strcmp(id,"int8"), iVar8 == 0 ||
          (((iVar8 = strcmp(id,"int16"), iVar8 == 0 || (iVar8 = strcmp(id,"int32"), iVar8 == 0)) ||
           (iVar8 = strcmp(id,"int64"), iVar8 == 0)))))) ||
        ((((iVar8 = strcmp(id,"leafref"), iVar8 == 0 || (iVar8 = strcmp(id,"string"), iVar8 == 0))
          || ((iVar8 = strcmp(id,"uint8"), iVar8 == 0 ||
              ((iVar8 = strcmp(id,"uint16"), iVar8 == 0 || (iVar8 = strcmp(id,"uint32"), iVar8 == 0)
               ))))) || (iVar8 = strcmp(id,"uint64"), iVar8 == 0)))) ||
       (iVar8 = strcmp(id,"union"), iVar8 == 0)) {
      ly_vlog(ctx,LYE_INARG,LY_VLOG_NONE,(void *)0x0,id,"typedef");
      ly_vlog(ctx,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Typedef name duplicates a built-in type.");
      return 1;
    }
    if (parent != (lys_node *)0x0) {
      do {
        LVar3 = parent->nodetype;
        if (LVar3 == LYS_GROUPING) {
          local_38 = (uint)*(ushort *)(parent->padding + 2);
          lVar13 = 0x68;
LAB_00127ce3:
          if (local_38 != 0) {
            lVar13 = *(long *)(parent->padding + lVar13 + -0x1c);
            uVar9 = 0;
            do {
              iVar8 = strcmp(id,*(char **)(lVar13 + uVar9));
              if (iVar8 == 0) goto LAB_00127fe5;
              uVar9 = uVar9 + 0x80;
            } while (local_38 << 7 != uVar9);
          }
        }
        else {
          if (LVar3 == LYS_LIST) {
            local_38 = (uint)parent->padding[1];
LAB_00127cca:
            lVar13 = 0x80;
            goto LAB_00127ce3;
          }
          if (LVar3 == LYS_CONTAINER) {
            local_38 = (uint)*(ushort *)(parent->padding + 2);
            goto LAB_00127cca;
          }
        }
        parent = lys_parent(parent);
      } while (parent != (lys_node *)0x0);
    }
    uVar2 = module->tpdf_size;
    if (uVar2 != 0) {
      plVar4 = module->tpdf;
      lVar13 = 0;
      do {
        iVar8 = strcmp(id,*(char **)(plVar4->padding + lVar13 + -0x1d));
        if (iVar8 == 0) goto LAB_00127fe5;
        lVar13 = lVar13 + 0x80;
      } while ((ulong)uVar2 * 0x80 != lVar13);
    }
    bVar12 = plVar11->inc_size;
    if ((ulong)bVar12 == 0) {
      return 0;
    }
    plVar5 = plVar11->inc;
    local_48 = 0;
    do {
      plVar7 = plVar5[local_48].submodule;
      if (plVar7 == (lys_submodule *)0x0) {
        return 0;
      }
      uVar2 = plVar7->tpdf_size;
      if (uVar2 != 0) {
        plVar4 = plVar7->tpdf;
        lVar13 = 0;
        do {
          iVar8 = strcmp(id,*(char **)(plVar4->padding + lVar13 + -0x1d));
          if (iVar8 == 0) goto LAB_00127fe5;
          lVar13 = lVar13 + 0x80;
        } while ((ulong)uVar2 * 0x80 != lVar13);
      }
      local_48 = local_48 + 1;
      if (local_48 == bVar12) {
        return 0;
      }
    } while( true );
  case LY_IDENT_NAME:
    if (parent == (lys_node *)0x0) {
      return 0;
    }
    plVar10 = parent->child;
    while( true ) {
      if (plVar10 == (lys_node *)0x0) {
        return 0;
      }
      if (plVar10->name == id) break;
      plVar10 = plVar10->next;
    }
    pcVar15 = "name duplication";
    goto LAB_00127fab;
  case LY_IDENT_PREFIX:
    if (module == (lys_module *)0x0) {
      __assert_fail("module",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                    ,0x944,
                    "int lyp_check_identifier(struct ly_ctx *, const char *, enum LY_IDENT, struct lys_module *, struct lys_node *)"
                   );
    }
    if ((module->prefix == (char *)0x0) || (iVar8 = strcmp(module->prefix,id), iVar8 != 0)) {
      bVar12 = module->imp_size;
      if ((ulong)bVar12 == 0) {
        return 0;
      }
      plVar6 = module->imp;
      lVar13 = 0;
      while (iVar8 = strcmp(*(char **)(plVar6->rev + lVar13 + -8),id), iVar8 != 0) {
        lVar13 = lVar13 + 0x38;
        if ((ulong)bVar12 * 0x38 - lVar13 == 0) {
          return 0;
        }
      }
    }
    pcVar14 = "prefix";
    break;
  case LY_IDENT_EXTENSION:
    if (module == (lys_module *)0x0) {
      __assert_fail("module",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                    ,0x961,
                    "int lyp_check_identifier(struct ly_ctx *, const char *, enum LY_IDENT, struct lys_module *, struct lys_node *)"
                   );
    }
    plVar11 = lys_main_module(module);
    if (plVar11->extensions_size != 0) {
      lVar13 = 0;
      do {
        if (*(char **)(plVar11->extensions->padding + lVar13 + -0x1b) == id) goto LAB_00127f37;
        lVar13 = lVar13 + 0x40;
      } while ((ulong)plVar11->extensions_size * 0x40 != lVar13);
    }
    if ((ulong)plVar11->inc_size == 0) {
      return 0;
    }
    uVar9 = 0;
    do {
      plVar7 = plVar11->inc[uVar9].submodule;
      if (plVar7 == (lys_submodule *)0x0) {
        return 0;
      }
      if (plVar7->extensions_size != 0) {
        lVar13 = 0;
        do {
          if (*(char **)(plVar7->extensions->padding + lVar13 + -0x1b) == id) goto LAB_00127f37;
          lVar13 = lVar13 + 0x40;
        } while ((ulong)plVar7->extensions_size * 0x40 != lVar13);
      }
      uVar9 = uVar9 + 1;
      if (uVar9 == plVar11->inc_size) {
        return 0;
      }
    } while( true );
  }
LAB_00127f57:
  ecode = LYE_DUPID;
LAB_00127fba:
  ly_vlog(ctx,ecode,LY_VLOG_NONE,(void *)0x0,pcVar14,id);
  return 1;
LAB_00127f37:
  pcVar14 = "extension";
  goto LAB_00127f57;
LAB_00127fe5:
  pcVar14 = "typedef";
  goto LAB_00127f57;
}

Assistant:

int
lyp_check_identifier(struct ly_ctx *ctx, const char *id, enum LY_IDENT type, struct lys_module *module,
                     struct lys_node *parent)
{
    int i, j;
    int size;
    struct lys_tpdf *tpdf;
    struct lys_node *node;
    struct lys_module *mainmod;
    struct lys_submodule *submod;

    assert(ctx && id);

    /* check id syntax */
    if (!(id[0] >= 'A' && id[0] <= 'Z') && !(id[0] >= 'a' && id[0] <= 'z') && id[0] != '_') {
        LOGVAL(ctx, LYE_INID, LY_VLOG_NONE, NULL, id, "invalid start character");
        return EXIT_FAILURE;
    }
    for (i = 1; id[i]; i++) {
        if (!(id[i] >= 'A' && id[i] <= 'Z') && !(id[i] >= 'a' && id[i] <= 'z')
                && !(id[i] >= '0' && id[i] <= '9') && id[i] != '_' && id[i] != '-' && id[i] != '.') {
            LOGVAL(ctx, LYE_INID, LY_VLOG_NONE, NULL, id, "invalid character");
            return EXIT_FAILURE;
        }
    }

    if (i > 64) {
        LOGWRN(ctx, "Identifier \"%s\" is long, you should use something shorter.", id);
    }

    switch (type) {
    case LY_IDENT_NAME:
        /* check uniqueness of the node within its siblings */
        if (!parent) {
            break;
        }

        LY_TREE_FOR(parent->child, node) {
            if (ly_strequal(node->name, id, 1)) {
                LOGVAL(ctx, LYE_INID, LY_VLOG_NONE, NULL, id, "name duplication");
                return EXIT_FAILURE;
            }
        }
        break;
    case LY_IDENT_TYPE:
        assert(module);
        mainmod = lys_main_module(module);

        /* check collision with the built-in types */
        if (!strcmp(id, "binary") || !strcmp(id, "bits") ||
                !strcmp(id, "boolean") || !strcmp(id, "decimal64") ||
                !strcmp(id, "empty") || !strcmp(id, "enumeration") ||
                !strcmp(id, "identityref") || !strcmp(id, "instance-identifier") ||
                !strcmp(id, "int8") || !strcmp(id, "int16") ||
                !strcmp(id, "int32") || !strcmp(id, "int64") ||
                !strcmp(id, "leafref") || !strcmp(id, "string") ||
                !strcmp(id, "uint8") || !strcmp(id, "uint16") ||
                !strcmp(id, "uint32") || !strcmp(id, "uint64") || !strcmp(id, "union")) {
            LOGVAL(ctx, LYE_INARG, LY_VLOG_NONE, NULL, id, "typedef");
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Typedef name duplicates a built-in type.");
            return EXIT_FAILURE;
        }

        /* check locally scoped typedefs (avoid name shadowing) */
        for (; parent; parent = lys_parent(parent)) {
            switch (parent->nodetype) {
            case LYS_CONTAINER:
                size = ((struct lys_node_container *)parent)->tpdf_size;
                tpdf = ((struct lys_node_container *)parent)->tpdf;
                break;
            case LYS_LIST:
                size = ((struct lys_node_list *)parent)->tpdf_size;
                tpdf = ((struct lys_node_list *)parent)->tpdf;
                break;
            case LYS_GROUPING:
                size = ((struct lys_node_grp *)parent)->tpdf_size;
                tpdf = ((struct lys_node_grp *)parent)->tpdf;
                break;
            default:
                continue;
            }

            if (dup_typedef_check(id, tpdf, size)) {
                LOGVAL(ctx, LYE_DUPID, LY_VLOG_NONE, NULL, "typedef", id);
                return EXIT_FAILURE;
            }
        }

        /* check top-level names */
        if (dup_typedef_check(id, module->tpdf, module->tpdf_size)) {
            LOGVAL(ctx, LYE_DUPID, LY_VLOG_NONE, NULL, "typedef", id);
            return EXIT_FAILURE;
        }

        /* check submodule's top-level names */
        for (i = 0; i < mainmod->inc_size && mainmod->inc[i].submodule; i++) {
            if (dup_typedef_check(id, mainmod->inc[i].submodule->tpdf, mainmod->inc[i].submodule->tpdf_size)) {
                LOGVAL(ctx, LYE_DUPID, LY_VLOG_NONE, NULL, "typedef", id);
                return EXIT_FAILURE;
            }
        }

        break;
    case LY_IDENT_PREFIX:
        assert(module);

        /* check the module itself */
        if (dup_prefix_check(id, module)) {
            LOGVAL(ctx, LYE_DUPID, LY_VLOG_NONE, NULL, "prefix", id);
            return EXIT_FAILURE;
        }
        break;
    case LY_IDENT_FEATURE:
        assert(module);
        mainmod = lys_main_module(module);

        /* check feature name uniqueness*/
        /* check features in the current module */
        if (dup_feature_check(id, module)) {
            LOGVAL(ctx, LYE_DUPID, LY_VLOG_NONE, NULL, "feature", id);
            return EXIT_FAILURE;
        }

        /* and all its submodules */
        for (i = 0; i < mainmod->inc_size && mainmod->inc[i].submodule; i++) {
            if (dup_feature_check(id, (struct lys_module *)mainmod->inc[i].submodule)) {
                LOGVAL(ctx, LYE_DUPID, LY_VLOG_NONE, NULL, "feature", id);
                return EXIT_FAILURE;
            }
        }
        break;

    case LY_IDENT_EXTENSION:
        assert(module);
        mainmod = lys_main_module(module);

        /* check extension name uniqueness in the main module ... */
        for (i = 0; i < mainmod->extensions_size; i++) {
            if (ly_strequal(id, mainmod->extensions[i].name, 1)) {
                LOGVAL(ctx, LYE_DUPID, LY_VLOG_NONE, NULL, "extension", id);
                return EXIT_FAILURE;
            }
        }

        /* ... and all its submodules */
        for (j = 0; j < mainmod->inc_size && mainmod->inc[j].submodule; j++) {
            submod = mainmod->inc[j].submodule; /* shortcut */
            for (i = 0; i < submod->extensions_size; i++) {
                if (ly_strequal(id, submod->extensions[i].name, 1)) {
                    LOGVAL(ctx, LYE_DUPID, LY_VLOG_NONE, NULL, "extension", id);
                    return EXIT_FAILURE;
                }
            }
        }

        break;

    default:
        /* no check required */
        break;
    }

    return EXIT_SUCCESS;
}